

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::StringFromGTestEnv_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *flag,char *default_value)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_70 [8];
  string env_var;
  allocator local_29;
  
  FlagToEnvVar_abi_cxx11_((string *)local_70,this,flag);
  pcVar2 = getenv((char *)local_70);
  if (pcVar2 == (char *)0x0) {
    iVar1 = strcmp((char *)this,"output");
    if (iVar1 == 0) {
      pcVar2 = getenv("XML_OUTPUT_FILE");
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::string((string *)(env_var.field_2._M_local_buf + 8),"xml:",&local_29);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&env_var.field_2 + 8),pcVar2);
        std::__cxx11::string::~string((string *)(env_var.field_2._M_local_buf + 8));
        goto LAB_00123dae;
      }
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,flag,(allocator *)(env_var.field_2._M_local_buf + 8)
              );
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar2,
               (allocator *)(env_var.field_2._M_local_buf + 8));
  }
LAB_00123dae:
  std::__cxx11::string::~string((string *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
  const std::string env_var = FlagToEnvVar(flag);
  const char* value = posix::GetEnv(env_var.c_str());
  if (value != NULL) {
    return value;
  }

  // As a special case for the 'output' flag, if GTEST_OUTPUT is not
  // set, we look for XML_OUTPUT_FILE, which is set by the Bazel build
  // system.  The value of XML_OUTPUT_FILE is a filename without the
  // "xml:" prefix of GTEST_OUTPUT.
  //
  // The net priority order after flag processing is thus:
  //   --gtest_output command line flag
  //   GTEST_OUTPUT environment variable
  //   XML_OUTPUT_FILE environment variable
  //   'default_value'
  if (strcmp(flag, "output") == 0) {
    value = posix::GetEnv("XML_OUTPUT_FILE");
    if (value != NULL) {
      return std::string("xml:") + value;
    }
  }
  return default_value;
}